

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QListView::setPositionForIndex(QListView *this,QPoint *position,QModelIndex *index)

{
  QAbstractItemViewPrivate *this_00;
  long *plVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QModelIndex local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if (*(int *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
               field_0x1c != 0) {
    bVar2 = QAbstractItemViewPrivate::isIndexValid(this_00,index);
    if (bVar2) {
      QModelIndex::parent(&local_40,index);
      bVar2 = ::operator!=(&local_40,&this_00->root);
      if ((!bVar2) &&
         (index->c ==
          *(int *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                   super_QWidgetPrivate.field_0x50)) {
        QAbstractItemViewPrivate::executePostedLayout(this_00);
        plVar1 = *(long **)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                            super_QWidgetPrivate;
        (**(code **)(*plVar1 + 0x98))(plVar1,position,index);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::setPositionForIndex(const QPoint &position, const QModelIndex &index)
{
    Q_D(QListView);
    if (d->movement == Static
        || !d->isIndexValid(index)
        || index.parent() != d->root
        || index.column() != d->column)
        return;

    d->executePostedLayout();
    d->commonListView->setPositionForIndex(position, index);
}